

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

int Bbl_ManSopCheckUnique(Bbl_Man_t *p,char *pSop,int nVars,int nCubes,int iFunc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  Bbl_Ent_t *pBVar5;
  Bbl_Fnc_t *pBVar6;
  int nWords;
  int Length;
  int h;
  Bbl_Ent_t *pEnt;
  Bbl_Fnc_t *pFnc;
  int local_28;
  int iFunc_local;
  int nCubes_local;
  int nVars_local;
  char *pSop_local;
  Bbl_Man_t *p_local;
  
  sVar4 = strlen(pSop);
  iVar1 = (int)sVar4 + 1;
  iVar2 = iVar1 / 4 + (uint)(0 < iVar1 % 4);
  iFunc_local = nVars;
  if (0x10 < nVars) {
    iFunc_local = 0x10;
  }
  local_28 = nCubes;
  if (0x10 < nCubes) {
    local_28 = 0x10;
  }
  nWords = p->SopMap[iFunc_local][local_28];
  while( true ) {
    if (nWords == 0) {
      iVar1 = Bbl_ManCreateEntry(p,iFunc,p->SopMap[iFunc_local][local_28]);
      p->SopMap[iFunc_local][local_28] = iVar1;
      return iFunc;
    }
    pBVar5 = Bbl_VecEnt(p->pEnts,nWords);
    pBVar6 = Bbl_VecFnc(p->pFncs,pBVar5->iFunc);
    if (((iFunc_local != 0x10) && (local_28 != 0x10)) && (pBVar6->nWords != iVar2)) break;
    if ((pBVar6->nWords == iVar2) && (iVar3 = memcmp(pBVar6 + 1,pSop,(long)iVar1), iVar3 == 0)) {
      return pBVar5->iFunc;
    }
    nWords = pBVar5->iNext;
  }
  __assert_fail("nVars == 16 || nCubes == 16 || pFnc->nWords == nWords",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/bbl/bblif.c"
                ,0x3a7,"int Bbl_ManSopCheckUnique(Bbl_Man_t *, char *, int, int, int)");
}

Assistant:

int Bbl_ManSopCheckUnique( Bbl_Man_t * p, char * pSop, int nVars, int nCubes, int iFunc )
{
    Bbl_Fnc_t * pFnc;
    Bbl_Ent_t * pEnt;
    int h, Length = strlen(pSop) + 1;
    int nWords = (Length / 4 + (Length % 4 > 0));
    if ( nVars > 16 )   nVars = 16;
    if ( nCubes > 16 )  nCubes = 16;
//    if ( nVars == 16 && nCubes == 16 )
//        return iFunc;
    for ( h = p->SopMap[nVars][nCubes]; h; h = pEnt->iNext )
    {
        pEnt = Bbl_VecEnt( p->pEnts, h );
        pFnc = Bbl_VecFnc( p->pFncs, pEnt->iFunc );
        assert( nVars == 16 || nCubes == 16 || pFnc->nWords == nWords );
        if ( pFnc->nWords == nWords && memcmp( pFnc->pWords, pSop, Length ) == 0 )
            return pEnt->iFunc;
    }
    p->SopMap[nVars][nCubes] = Bbl_ManCreateEntry( p, iFunc, p->SopMap[nVars][nCubes] );
    return iFunc;
}